

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

string * __thiscall
EOPlus::Parser::ParseQuestName_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  Parser_Token_Server_Base *pPVar2;
  bool bVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  Token *t_00;
  int iVar6;
  Token t;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [24];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  bool local_d8;
  bool bStack_d7;
  bool bStack_d6;
  bool bStack_d5;
  bool bStack_d4;
  undefined3 uStack_d3;
  var_type local_d0;
  int local_c8;
  variant local_c0;
  Token local_80;
  
  util::variant::variant(&local_c0);
  local_110._0_4_ = Invalid;
  local_110._8_4_ = local_c0.val_int;
  local_110._12_4_ = local_c0._4_4_;
  local_110._16_4_ = local_c0.val_float._0_4_;
  local_110._20_4_ = local_c0.val_float._4_4_;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_c0.val_string._M_dataplus._M_p,
             local_c0.val_string._M_dataplus._M_p + local_c0.val_string._M_string_length);
  local_d0 = local_c0.type;
  local_d8 = local_c0.val_bool;
  bStack_d7 = local_c0.cache_val[0];
  bStack_d6 = local_c0.cache_val[1];
  bStack_d5 = local_c0.cache_val[2];
  bStack_d4 = local_c0.cache_val[3];
  uStack_d3 = local_c0._53_3_;
  local_c8 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val_string._M_dataplus._M_p != &local_c0.val_string.field_2) {
    operator_delete(local_c0.val_string._M_dataplus._M_p,
                    local_c0.val_string.field_2._M_allocated_capacity + 1);
  }
  bVar3 = GetToken(this,(Token *)local_110,2);
  if (bVar3) {
    util::variant::GetString_abi_cxx11_(__return_storage_ptr__,(variant *)(local_110 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"Expected string after \'questname\'.","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_190);
  local_170._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_170._M_dataplus._M_p == psVar5) {
    local_170.field_2._M_allocated_capacity = *psVar5;
    local_170.field_2._8_8_ = plVar4[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar5;
  }
  local_170._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Parser_Token_Server_Base::RejectToken
            (&local_80,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
  token_got_string_abi_cxx11_(&local_150,(EOPlus *)&local_80,t_00);
  std::operator+(&local_130,&local_170,&local_150);
  pPVar2 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar1 = pPVar2->line;
  iVar6 = pPVar2->reject_line;
  std::runtime_error::runtime_error(this_00,(string *)&local_130);
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  *(int *)(this_00 + 0x10) = iVar6;
  *(undefined ***)this_00 = &PTR__runtime_error_00201c68;
  __cxa_throw(this_00,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Parser::ParseQuestName()
	{
		Token t;

		if (this->GetToken(t, Token::String))
			return std::string(t.data);

		PARSER_ERROR_GOT("Expected string after 'questname'.");
	}